

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void dirCSPECTMAP(void)

{
  char cVar1;
  CDevicePage *pCVar2;
  path fName;
  path local_30;
  
  if (pass != 3 || DeviceID == (char *)0x0) {
    if (DeviceID == (char *)0x0) {
      Error("CSPECTMAP only allowed in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
    }
    SkipParam(&lp);
    return;
  }
  GetOutputFileName_abi_cxx11_(&local_30,&lp);
  cVar1 = std::filesystem::__cxx11::path::has_filename();
  if (cVar1 == '\0') {
    if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
        super__Vector_impl_data._M_start ==
        sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("!sourcePosStack.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/directives.cpp"
                    ,0x509,"void dirCSPECTMAP()");
    }
    std::filesystem::__cxx11::path::operator=
              ((path *)&Options::CSpectMapFName_abi_cxx11_,
               &sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl
                .super__Vector_impl_data._M_finish[-1].filename);
    std::filesystem::__cxx11::path::_M_concat(&Options::CSpectMapFName_abi_cxx11_,4,".map");
  }
  else {
    std::filesystem::__cxx11::path::operator=((path *)&Options::CSpectMapFName_abi_cxx11_,&local_30)
    ;
  }
  pCVar2 = CDevice::GetPage(Device,0);
  Options::CSpectMapPageSize = pCVar2->Size;
  std::filesystem::__cxx11::path::~path(&local_30);
  return;
}

Assistant:

static void dirCSPECTMAP() {
	if (LASTPASS != pass || !DeviceID) {
		if (!DeviceID) Error("CSPECTMAP only allowed in real device emulation mode (See DEVICE)");
		SkipParam(lp);
		return;
	}
	const std::filesystem::path fName = GetOutputFileName(lp);
	if (fName.has_filename()) {
		Options::CSpectMapFName = fName;
	} else {		// create default map file name from current source file name (appends ".map")
		assert(!sourcePosStack.empty());
		Options::CSpectMapFName = sourcePosStack.back().filename;
		Options::CSpectMapFName += ".map";
	}
	// remember page size of current device (in case the source is multi-device later)
	Options::CSpectMapPageSize = Device->GetPage(0)->Size;
}